

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoBodies::Build_Cq
          (ChConstraintTwoBodies *this,ChSparseMatrix *storage,int insrow)

{
  int iVar1;
  ChVariables *pCVar2;
  int j;
  long lVar3;
  
  pCVar2 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[lVar3],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar3),
                 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  pCVar2 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
                 .m_data.array[lVar3],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar3),
                 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  return;
}

Assistant:

void ChConstraintTwoBodies::Build_Cq(ChSparseMatrix& storage, int insrow) {
    if (variables_a->IsActive())
        PasteMatrix(storage, Cq_a, insrow, variables_a->GetOffset());
    if (variables_b->IsActive())
        PasteMatrix(storage, Cq_b, insrow, variables_b->GetOffset());
}